

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRenderCase.cpp
# Opt level: O1

void __thiscall
deqp::egl::SingleContextRenderCase::executeForSurface
          (SingleContextRenderCase *this,EGLDisplay display,EGLSurface surface,Config *config)

{
  uint uVar1;
  bool bVar2;
  EGLSurface pvVar3;
  Config *pCVar4;
  deUint32 dVar5;
  int iVar6;
  Library *egl;
  size_t sVar7;
  undefined4 extraout_var;
  uint uVar8;
  char *pcVar9;
  long lVar10;
  vector<int,_std::allocator<int>_> contextAttribs;
  UniqueContext context;
  vector<int,_std::allocator<int>_> local_208;
  uint local_1ec;
  SingleContextRenderCase *local_1e8;
  EGLSurface local_1e0;
  Config *local_1d8;
  EGLDisplay local_1d0;
  Library *local_1c8;
  EGLConfig local_1c0;
  EGLint local_1b8;
  uint local_1b4;
  undefined1 local_1b0 [8];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  egl = EglTestContext::getLibrary
                  ((this->super_RenderCase).super_SimpleConfigCase.super_TestCase.m_eglTestCtx);
  local_1c8 = (Library *)
              ((this->super_RenderCase).super_SimpleConfigCase.super_TestCase.super_TestCase.
               super_TestNode.m_testCtx)->m_log;
  local_1ec = eglu::getConfigAttribInt(egl,display,config->config,0x3040);
  local_1e8 = this;
  checkBuildClientAPISupport(*(EGLint *)&(this->super_RenderCase).field_0xbc);
  lVar10 = 0;
  local_1e0 = surface;
  local_1d8 = config;
  local_1d0 = display;
  do {
    uVar1 = *(uint *)((long)&DAT_01bf0ac0 + lVar10);
    if (((local_1ec & uVar1) != 0) &&
       ((*(uint *)&(local_1e8->super_RenderCase).field_0xbc & uVar1) != 0)) {
      local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (int *)0x0;
      local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (int *)0x0;
      uVar8 = 0x3038;
      bVar2 = true;
      if ((int)uVar1 < 4) {
        if (uVar1 == 1) {
          local_1b0._0_4_ = 0x3098;
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_208,(iterator)0x0,(int *)local_1b0);
          local_1b0._0_4_ = 1;
          if (local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&local_208,
                       (iterator)
                       local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(int *)local_1b0);
          }
          else {
            *local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish = 1;
            local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
          uVar8 = 0x30a0;
          bVar2 = false;
          pcVar9 = "OpenGL ES 1.x";
        }
        else {
          pcVar9 = (char *)0x0;
          if (uVar1 == 2) {
            uVar8 = 0x30a1;
            bVar2 = false;
            pcVar9 = "OpenVG";
          }
        }
      }
      else if (uVar1 == 0x40) {
        local_1b0._0_4_ = 0x3098;
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_208,(iterator)0x0,(int *)local_1b0);
        local_1b0._0_4_ = 3;
        if (local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_208,
                     (iterator)
                     local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)local_1b0);
        }
        else {
          *local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = 3;
          local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        uVar8 = 0x30a0;
        bVar2 = false;
        pcVar9 = "OpenGL ES 3.x";
      }
      else {
        pcVar9 = (char *)0x0;
        if (uVar1 == 4) {
          local_1b0._0_4_ = 0x3098;
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_208,(iterator)0x0,(int *)local_1b0);
          local_1b0._0_4_ = 2;
          if (local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&local_208,
                       (iterator)
                       local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(int *)local_1b0);
          }
          else {
            *local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish = 2;
            local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
          uVar8 = 0x30a0;
          bVar2 = false;
          pcVar9 = "OpenGL ES 2.x";
        }
      }
      local_1b0._0_4_ = 0x3038;
      if (local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_208,
                   (iterator)
                   local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)local_1b0);
      }
      else {
        *local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = 0x3038;
        local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      local_1b0 = (undefined1  [8])local_1c8;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      if (bVar2) {
        std::ios::clear((int)local_1a8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
      }
      else {
        sVar7 = strlen(pcVar9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar9,sVar7);
      }
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      (**egl->_vptr_Library)(egl,(ulong)uVar8);
      dVar5 = (*egl->_vptr_Library[0x1f])(egl);
      eglu::checkError(dVar5,"bindAPI(api)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderCase.cpp"
                       ,0x114);
      display = local_1d0;
      pCVar4 = local_1d8;
      iVar6 = (*egl->_vptr_Library[6])
                        (egl,local_1d0,local_1d8->config,0,
                         local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start);
      pvVar3 = local_1e0;
      eglu::UniqueContext::UniqueContext
                ((UniqueContext *)local_1b0,egl,display,(EGLContext)CONCAT44(extraout_var,iVar6));
      (*egl->_vptr_Library[0x27])(egl,display,pvVar3,pvVar3,local_1a8._8_8_);
      dVar5 = (*egl->_vptr_Library[0x1f])(egl);
      eglu::checkError(dVar5,"makeCurrent(display, surface, surface, *context)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderCase.cpp"
                       ,0x118);
      local_1c0 = pCVar4->config;
      local_1b8 = pCVar4->surfaceTypeBit;
      local_1b4 = uVar1;
      (*(local_1e8->super_RenderCase).super_SimpleConfigCase.super_TestCase.super_TestCase.
        super_TestNode._vptr_TestNode[7])(local_1e8,display,local_1a8._8_8_,pvVar3,&local_1c0);
      iVar6 = pCVar4->surfaceTypeBit;
      if (iVar6 == 1) {
        (*egl->_vptr_Library[0x36])(egl);
        dVar5 = (*egl->_vptr_Library[0x1f])(egl);
        iVar6 = 0x43;
LAB_00e876ba:
        pcVar9 = "waitClient()";
LAB_00e876c1:
        eglu::checkError(dVar5,pcVar9,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderCase.cpp"
                         ,iVar6);
      }
      else {
        if (iVar6 == 2) {
          (*egl->_vptr_Library[0x36])(egl);
          dVar5 = (*egl->_vptr_Library[0x1f])(egl);
          iVar6 = 0x41;
          goto LAB_00e876ba;
        }
        if (iVar6 == 4) {
          (*egl->_vptr_Library[0x31])(egl,display,pvVar3);
          dVar5 = (*egl->_vptr_Library[0x1f])(egl);
          iVar6 = 0x3f;
          pcVar9 = "swapBuffers(display, surface)";
          goto LAB_00e876c1;
        }
      }
      eglu::UniqueContext::~UniqueContext((UniqueContext *)local_1b0);
      if (local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    lVar10 = lVar10 + 4;
    if (lVar10 == 0x10) {
      (*egl->_vptr_Library[0x27])(egl,display,0,0,0);
      dVar5 = (*egl->_vptr_Library[0x1f])(egl);
      eglu::checkError(dVar5,"makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderCase.cpp"
                       ,0x11f);
      return;
    }
  } while( true );
}

Assistant:

void SingleContextRenderCase::executeForSurface (EGLDisplay display, EGLSurface surface, const Config& config)
{
	const Library&		egl				= m_eglTestCtx.getLibrary();
	const EGLint		apis[]			= { EGL_OPENGL_ES2_BIT, EGL_OPENGL_ES3_BIT_KHR, EGL_OPENGL_ES_BIT, EGL_OPENVG_BIT };
	tcu::TestLog&		log				= m_testCtx.getLog();
	const EGLint		configApiMask	= eglu::getConfigAttribInt(egl, display, config.config, EGL_RENDERABLE_TYPE);

	checkBuildClientAPISupport(m_apiMask);

	for (int apiNdx = 0; apiNdx < DE_LENGTH_OF_ARRAY(apis); apiNdx++)
	{
		EGLint apiBit = apis[apiNdx];

		// Skip API if build or current config doesn't support it.
		if ((apiBit & m_apiMask) == 0 || (apiBit & configApiMask) == 0)
			continue;

		EGLint			api		= EGL_NONE;
		const char*		apiName	= DE_NULL;
		vector<EGLint>	contextAttribs;

		// Select api enum and build context attributes.
		switch (apiBit)
		{
			case EGL_OPENGL_ES2_BIT:
				api		= EGL_OPENGL_ES_API;
				apiName	= "OpenGL ES 2.x";
				contextAttribs.push_back(EGL_CONTEXT_CLIENT_VERSION);
				contextAttribs.push_back(2);
				break;

			case EGL_OPENGL_ES3_BIT_KHR:
				api		= EGL_OPENGL_ES_API;
				apiName	= "OpenGL ES 3.x";
				contextAttribs.push_back(EGL_CONTEXT_MAJOR_VERSION_KHR);
				contextAttribs.push_back(3);
				break;

			case EGL_OPENGL_ES_BIT:
				api		= EGL_OPENGL_ES_API;
				apiName	= "OpenGL ES 1.x";
				contextAttribs.push_back(EGL_CONTEXT_CLIENT_VERSION);
				contextAttribs.push_back(1);
				break;

			case EGL_OPENVG_BIT:
				api		= EGL_OPENVG_API;
				apiName	= "OpenVG";
				break;

			default:
				DE_ASSERT(DE_FALSE);
		}

		contextAttribs.push_back(EGL_NONE);

		log << TestLog::Message << apiName << TestLog::EndMessage;

		EGLU_CHECK_CALL(egl, bindAPI(api));

		eglu::UniqueContext	context	(egl, display, egl.createContext(display, config.config, EGL_NO_CONTEXT, &contextAttribs[0]));

		EGLU_CHECK_CALL(egl, makeCurrent(display, surface, surface, *context));
		executeForContext(display, *context, surface, Config(config.config, config.surfaceTypeBit, apiBit));

		// Call SwapBuffers() / WaitClient() to finish rendering
		postSurface(egl, display, surface, config.surfaceTypeBit);
	}

	EGLU_CHECK_CALL(egl, makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));
}